

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O3

void __thiscall
bf_crc::show_hit(bf_crc *this,crc_model_t model,
                vector<bf_crc::vector_,_std::allocator<bf_crc::vector_>_> *test_vectors)

{
  pointer pvVar1;
  undefined8 uVar2;
  ostream *poVar3;
  long *plVar4;
  pointer *__dest;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  size_type __dnew;
  pointer *local_418;
  pointer local_410;
  pointer local_408 [2];
  uint32_t local_3f8;
  undefined1 local_3f4 [12];
  string local_3e8;
  undefined1 local_3c8 [24];
  _Bit_type *local_3b0;
  uint local_3a8;
  _Bit_type *local_3a0;
  uint local_398;
  _Bit_pointer local_390;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  bool local_2f8;
  locale local_2f0 [8];
  undefined1 local_2e8 [32];
  uint local_2c8;
  _Bit_type *local_2c0;
  uint local_2b8;
  _Bit_pointer local_2b0;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  bool local_218;
  locale local_210 [8];
  undefined1 local_208 [24];
  _Bit_type *local_1f0;
  uint local_1e8;
  _Bit_type *local_1e0;
  uint local_1d8;
  _Bit_pointer local_1d0;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  bool local_138;
  locale local_130 [8];
  undefined1 local_128 [224];
  put_holder<char,_std::char_traits<char>_> local_48;
  
  if (this->quiet_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "----------------------------[ MATCH ]--------------------------------\n",0x46);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Found a model for the CRC calculation:\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Truncated polynom : 0x",0x16);
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
         8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Initial value     : 0x",0x16);
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Final XOR         : 0x",0x16);
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reflected input   : ",0x14);
    pcVar9 = "false";
    pcVar8 = "false";
    if ((ulong)model.reflected_input != 0) {
      pcVar8 = "true";
    }
    local_208._0_8_ = (pointer)(local_208 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,pcVar8,pcVar8 + ((ulong)model.reflected_input ^ 5));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_208._0_8_,local_208._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Reflected output  : ",0x14);
    if ((ulong)model.reflected_output != 0) {
      pcVar9 = "true";
    }
    local_3c8._0_8_ = (pointer)(local_3c8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3c8,pcVar9,pcVar9 + ((ulong)model.reflected_output ^ 5));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_3c8._0_8_,local_3c8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    pcVar8 = "Feed type         : ";
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Feed type         : ",0x14);
    feed_type_to_str_abi_cxx11_((string *)local_2e8,(bf_crc *)pcVar8,model.feed_type);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_2e8._0_8_,local_2e8._8_8_);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::ostream::flush();
    if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
    if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_,(ulong)((long)(int *)local_3c8._16_8_ + 1));
    }
    if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,(ulong)((long)(int *)local_208._16_8_ + 1));
    }
    if ((((model.feed_type == BYTEWISE_REVERSED) || (model.feed_type == AUTO)) &&
        (pvVar1 = (test_vectors->
                  super__Vector_base<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        (test_vectors->super__Vector_base<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pvVar1)) &&
       (((pvVar1->message).m_num_bits & 7) == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "----------------------------[ Example implementation ]--------------------------------"
                 ,0x56);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"#include <stdint.h>",0x13);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"#include <stdio.h>",0x12);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"#define STANDARD_FEEDING (7-i)",0x1e);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"#define BYTEWISE_REVERSE_FEEDING (i)",0x24);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"#define FEEDING ",0x10);
      pcVar8 = "STANDARD_FEEDING";
      if (model.reflected_input != false) {
        pcVar8 = "BYTEWISE_REVERSE_FEEDING";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,pcVar8,(ulong)model.reflected_input * 8 + 0x10);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      poVar3 = (ostream *)std::ostream::flush();
      local_418 = local_408;
      if (model.reflected_output == true) {
        local_208._0_8_ = (pointer)0x10c;
        __dest = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)local_208);
        uVar2 = local_208._0_8_;
        local_408[0] = (pointer)local_208._0_8_;
        local_418 = __dest;
        memcpy(__dest,
               "uint32_t reflect_output(uint32_t  x ) {\n  uint32_t reflection = 0;\n  uint32_t const  one = 1;\n  uint32_t width_ = 16;\n  for( uint32_t i = 0 ; i < width_ ; ++i, x >>= 1 ) {\n    if ( x & one )\n      reflection |= ( one << (width_ - 1u - i) );\n  }\n  return reflection;\n}\n"
               ,0x10c);
        local_410 = (pointer)uVar2;
        *(char *)((long)__dest + uVar2) = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_418,(long)local_410);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,
                 "uint16_t calc_crc(uint16_t poly, uint16_t initial, uint16_t final_xor, uint8_t * buf, unsigned int len) {"
                 ,0x69);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  uint16_t crc = initial;",0x19);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  unsigned int i, k;",0x14);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      pcVar8 = "";
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"",0);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"  for(k = 0; k < len; k++ ) {",0x1d);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"    for(i = 0; i < 8; i++ ) {",0x1d);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"      int bit = ((buf[k] >> FEEDING & 1) == 1);",0x2f);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"      int c15 = ((crc >> 15 & 1) == 1);",0x27);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"      crc <<= 1;",0x10);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"      if(c15 ^ bit) crc ^= poly;",0x20);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    }",5);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  }",3);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      if (model.reflected_output != false) {
        pcVar8 = "  crc = reflect_output(crc);";
      }
      lVar7 = 0x1c;
      if (model.reflected_output == false) {
        lVar7 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar8,lVar7);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  crc ^= final_xor;",0x13);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  return crc;",0xd);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"int main(int argc, char * argv) {",0x21);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"",0);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  uint8_t buf[] = { ",0x14);
      bitset_to_byte_array_abi_cxx11_
                (&local_3e8,
                 &((test_vectors->
                   super__Vector_base<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>)._M_impl.
                   super__Vector_impl_data._M_start)->message);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};",2);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  uint16_t crc = ",0x11);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 "0x%04x");
      local_3f4._8_4_ =
           ((test_vectors->super__Vector_base<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>).
            _M_impl.super__Vector_impl_data._M_start)->crc;
      local_3c8._0_8_ = local_3f4 + 8;
      local_3c8._8_8_ = boost::io::detail::call_put_head<char,std::char_traits<char>,int_const>;
      local_3c8._16_8_ = boost::io::detail::call_put_last<char,std::char_traits<char>,int_const>;
      pbVar5 = boost::io::detail::
               feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                         ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_208,(put_holder<char,_std::char_traits<char>_> *)local_3c8);
      pbVar6 = boost::operator<<(poVar3,pbVar5);
      std::__ostream_insert<char,std::char_traits<char>>(pbVar6,";",1);
      std::ios::widen((char)pbVar6->_vptr_basic_ostream[-3] + (char)pbVar6);
      std::ostream::put((char)pbVar6);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  if(calc_crc( ",0xf);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                 "0x%04x");
      local_2e8._0_8_ = local_3f4 + 4;
      local_3f4._4_4_ = model.polynomial;
      local_2e8._8_8_ = boost::io::detail::call_put_head<char,std::char_traits<char>,int_const>;
      local_2e8._16_8_ = boost::io::detail::call_put_last<char,std::char_traits<char>,int_const>;
      pbVar5 = boost::io::detail::
               feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                         ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3c8,(put_holder<char,_std::char_traits<char>_> *)local_2e8);
      pbVar6 = boost::operator<<(poVar3,pbVar5);
      std::__ostream_insert<char,std::char_traits<char>>(pbVar6,", ",2);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                 "0x%04x");
      local_128._0_8_ = local_3f4;
      local_3f4._0_4_ = model.initial;
      local_128._8_8_ = boost::io::detail::call_put_head<char,std::char_traits<char>,int_const>;
      local_128._16_8_ = boost::io::detail::call_put_last<char,std::char_traits<char>,int_const>;
      pbVar5 = boost::io::detail::
               feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                         ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2e8,(put_holder<char,_std::char_traits<char>_> *)local_128);
      pbVar6 = boost::operator<<(pbVar6,pbVar5);
      std::__ostream_insert<char,std::char_traits<char>>(pbVar6,", ",2);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                 "0x%04x");
      local_48.arg = &local_3f8;
      local_3f8 = model.final_xor;
      local_48.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,int_const>;
      local_48.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,int_const>;
      pbVar5 = boost::io::detail::
               feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                         ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_128,&local_48);
      pbVar6 = boost::operator<<(pbVar6,pbVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (pbVar6,", buf, sizeof(buf)) == crc) puts(\"CRC matches\");",0x30);
      std::ios::widen((char)pbVar6->_vptr_basic_ostream[-3] + (char)pbVar6);
      std::ostream::put((char)pbVar6);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"  else puts(\"CRC does not match\");",0x22);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_128[0xd0] == true) {
        std::locale::~locale((locale *)(local_128 + 0xd8));
        local_128[0xd0] = false;
      }
      boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_altstringbuf((basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )(local_128 + 0x78));
      if ((undefined1 *)local_128._80_8_ != local_128 + 0x60) {
        operator_delete((void *)local_128._80_8_,local_128._96_8_ + 1);
      }
      if ((_Bit_type *)local_128._24_8_ != (_Bit_type *)0x0) {
        operator_delete((void *)local_128._24_8_,local_128._56_8_ - local_128._24_8_);
        local_128._24_8_ = (_Bit_type *)0x0;
        local_128._32_4_ = 0;
        local_128._40_8_ = (_Bit_type *)0x0;
        local_128._48_4_ = 0;
        local_128._56_8_ = (_Bit_pointer)0x0;
      }
      std::
      vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      if (local_218 == true) {
        std::locale::~locale(local_210);
        local_218 = false;
      }
      boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_altstringbuf(&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_p != &local_288) {
        operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
      }
      if ((void *)local_2e8._24_8_ != (void *)0x0) {
        operator_delete((void *)local_2e8._24_8_,(long)local_2b0 - local_2e8._24_8_);
        local_2e8._24_8_ = (void *)0x0;
        local_2c8 = 0;
        local_2c0 = (_Bit_type *)0x0;
        local_2b8 = 0;
        local_2b0 = (_Bit_pointer)0x0;
      }
      std::
      vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e8);
      if (local_2f8 == true) {
        std::locale::~locale(local_2f0);
        local_2f8 = false;
      }
      boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_altstringbuf(&local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_p != &local_368) {
        operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
      }
      if (local_3b0 != (_Bit_type *)0x0) {
        operator_delete(local_3b0,(long)local_390 - (long)local_3b0);
        local_3b0 = (_Bit_type *)0x0;
        local_3a8 = 0;
        local_3a0 = (_Bit_type *)0x0;
        local_398 = 0;
        local_390 = (_Bit_pointer)0x0;
      }
      std::
      vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3c8);
      if (local_138 == true) {
        std::locale::~locale(local_130);
        local_138 = false;
      }
      boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_altstringbuf(&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_p != &local_1a8) {
        operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
      }
      if (local_1f0 != (_Bit_type *)0x0) {
        operator_delete(local_1f0,(long)local_1d0 - (long)local_1f0);
        local_1f0 = (_Bit_type *)0x0;
        local_1e8 = 0;
        local_1e0 = (_Bit_type *)0x0;
        local_1d8 = 0;
        local_1d0 = (_Bit_pointer)0x0;
      }
      std::
      vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if (local_418 != local_408) {
        operator_delete(local_418,(ulong)((long)&local_408[0]->argN_ + 1));
      }
    }
  }
  return;
}

Assistant:

void bf_crc::show_hit(crc_model_t model, std::vector<test_vector_t> test_vectors) {

  if (quiet_) return;


  std::cout 
    << "----------------------------[ MATCH ]--------------------------------\n"
    << "Found a model for the CRC calculation:\n"
    << "Truncated polynom : 0x" << std::hex << model.polynomial << " (" << std::dec << model.polynomial << ")\n"
    << "Initial value     : 0x" << std::hex << model.initial << " (" << std::dec << model.initial << ")\n"
    << "Final XOR         : 0x" << std::hex << model.final_xor << " (" << std::dec << model.final_xor << ")\n"
    << "Reflected input   : " << bool_to_str(model.reflected_input) << "\n"
    << "Reflected output  : " << bool_to_str(model.reflected_output) << "\n"
    << "Feed type         : " << feed_type_to_str(model.feed_type) << std::endl
    << std::endl << std::flush;

  
  // print an implementation
  
  if((model.feed_type == my_crc_basic::BYTEWISE_REVERSED || model.feed_type == my_crc_basic::AUTO) &&
     (test_vectors.size() > 0) &&
     (test_vectors[0].message.size() % 8 == 0)) {
    
    std::cout 
      << "----------------------------[ Example implementation ]--------------------------------" << std::endl
      << "#include <stdint.h>" << std::endl
      << "#include <stdio.h>" << std::endl
      << std::endl
      << "#define STANDARD_FEEDING (7-i)" << std::endl
      << "#define BYTEWISE_REVERSE_FEEDING (i)" << std::endl
      << "#define FEEDING " << (model.reflected_input == true ? "BYTEWISE_REVERSE_FEEDING" : "STANDARD_FEEDING") << std::endl
      << std::endl
      << (model.reflected_output == true ? show_reflect_output() : std::string("")) << std::endl
      << "uint16_t calc_crc(uint16_t poly, uint16_t initial, uint16_t final_xor, uint8_t * buf, unsigned int len) {" << std::endl
      << "  uint16_t crc = initial;" << std::endl
      << "  unsigned int i, k;" << std::endl
      << "" << std::endl
      << "  for(k = 0; k < len; k++ ) {" << std::endl
      << "    for(i = 0; i < 8; i++ ) {" << std::endl
      << "      int bit = ((buf[k] >> FEEDING & 1) == 1);" << std::endl
      << "      int c15 = ((crc >> 15 & 1) == 1);" << std::endl
      << "      crc <<= 1;" << std::endl
      << "      if(c15 ^ bit) crc ^= poly;" << std::endl
      << "    }" << std::endl
      << "  }" << std::endl
      << (model.reflected_output == true ? "  crc = reflect_output(crc);" : "") << std::endl
      << "  crc ^= final_xor;" << std::endl
      << "  return crc;" << std::endl
      << "}" << std::endl
      << std::endl
      << "int main(int argc, char * argv) {" << std::endl
      << "" << std::endl
      << "  uint8_t buf[] = { " << bitset_to_byte_array(test_vectors[0].message) << "};" << std::endl
      << "  uint16_t crc = " << (boost::format("0x%04x") % static_cast<int>(test_vectors[0].crc)) << ";" << std::endl
      << "  " << std::endl
      << "  if(calc_crc( "<< (boost::format("0x%04x") % static_cast<int>(model.polynomial)) << ", " 
      << (boost::format("0x%04x") % static_cast<int>(model.initial)) << ", " 
      << (boost::format("0x%04x") % static_cast<int>(model.final_xor)) << ", buf, sizeof(buf)) == crc) puts(\"CRC matches\");" << std::endl
      << "  else puts(\"CRC does not match\");" << std::endl
      << "  " << std::endl
      << "}" << std::endl;
    
  }
}